

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase615::run(TestCase615 *this)

{
  StructDataBitCount *this_00;
  Builder reader_00;
  Builder reader_01;
  Reader reader_02;
  Reader reader_03;
  initializer_list<unsigned_short> expected;
  initializer_list<unsigned_short> list;
  initializer_list<unsigned_char> expected_00;
  initializer_list<unsigned_short> expected_01;
  initializer_list<unsigned_char> expected_02;
  initializer_list<unsigned_short> list_00;
  uint8_t uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  Type *func;
  unsigned_short local_986 [3];
  iterator local_980;
  undefined8 local_978;
  Reader local_970;
  ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_950;
  Reader local_920;
  uint32_t local_8ec;
  uint local_8e8;
  bool local_8e1;
  undefined1 local_8e0 [7];
  bool _kj_shouldLog_9;
  Reader local_8b0;
  uint32_t local_87c;
  uint local_878;
  bool local_871;
  undefined1 local_870 [7];
  bool _kj_shouldLog_8;
  Reader local_840;
  uint32_t local_80c;
  uint local_808;
  bool local_801;
  undefined1 local_800 [7];
  bool _kj_shouldLog_7;
  uint local_7d0;
  uint local_7cc;
  Fault local_7c8;
  Fault f_2;
  undefined1 local_7a0 [8];
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>_> l_2;
  undefined1 *puStack_768;
  bool _kj_shouldLog_6;
  undefined1 local_760 [8];
  Maybe<kj::Exception> e;
  Builder local_5e8;
  Reader local_5d0;
  uint8_t local_599;
  uint local_598;
  bool local_591;
  undefined1 local_590 [7];
  bool _kj_shouldLog_5;
  Reader local_560;
  uint8_t local_529;
  uint local_528;
  bool local_521;
  undefined1 local_520 [7];
  bool _kj_shouldLog_4;
  Reader local_4f0;
  uint8_t local_4b9;
  uint local_4b8;
  bool local_4b1;
  undefined1 local_4b0 [7];
  bool _kj_shouldLog_3;
  uint local_480;
  uint local_47c;
  Fault local_478;
  Fault f_1;
  undefined1 local_450 [8];
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>_> l_1;
  Reader local_408;
  ReaderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_3e8;
  undefined1 local_3b8 [8];
  Reader reader;
  Builder local_370;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_358;
  Builder local_330;
  uint8_t local_301;
  uint local_300;
  bool local_2f9;
  undefined1 local_2f8 [7];
  bool _kj_shouldLog_2;
  Builder local_2d0;
  uint8_t local_2a1;
  uint local_2a0;
  bool local_299;
  undefined1 local_298 [7];
  bool _kj_shouldLog_1;
  Builder local_270;
  uint8_t local_241;
  uint local_240;
  bool local_239;
  undefined1 local_238 [7];
  bool _kj_shouldLog;
  uint local_210;
  uint local_20c;
  Fault local_208;
  Fault f;
  undefined1 local_1e8 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>_> l;
  Builder local_1a8;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_190;
  unsigned_short local_166 [3];
  iterator local_160;
  undefined8 local_158;
  Builder local_150;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase615 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_150,(Builder *)local_128);
  local_166[0] = 0xc;
  local_166[1] = 0x22;
  local_166[2] = 0x38;
  local_160 = local_166;
  local_158 = 3;
  list_00._M_len = 3;
  list_00._M_array = local_160;
  AnyPointer::Builder::setAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_150,list_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_1a8,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_190,&local_1a8);
  l.builder.structPointerCount._1_1_ = 0xc;
  l.builder.elementSize = 0x22;
  l.builder._39_1_ = 0x38;
  expected_02._M_len = 3;
  expected_02._M_array = (iterator)((long)&l.builder.structPointerCount + 1);
  reader_00.builder.capTable = local_190.builder.capTable;
  reader_00.builder.segment = local_190.builder.segment;
  reader_00.builder.ptr = local_190.builder.ptr;
  reader_00.builder.elementCount = local_190.builder.elementCount;
  reader_00.builder.step = local_190.builder.step;
  reader_00.builder.structDataSize = local_190.builder.structDataSize;
  reader_00.builder.structPointerCount = local_190.builder.structPointerCount;
  reader_00.builder.elementSize = local_190.builder.elementSize;
  reader_00.builder._39_1_ = local_190.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_00,expected_02);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&f,(Builder *)local_128);
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>_>
              *)local_1e8,(Builder *)&f);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_1e8);
  if (uVar3 != 3) {
    local_20c = 3;
    local_210 = List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::size
                          ((Builder *)local_1e8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x271,FAILED,"(3u) == (l.size())","3u, l.size()",&local_20c,&local_210);
    kj::_::Debug::Fault::fatal(&local_208);
  }
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_238,(Builder *)local_1e8,0);
  uVar1 = capnproto_test::capnp::test::TestLists::Struct8::Builder::getF((Builder *)local_238);
  if (uVar1 != '\f') {
    local_239 = kj::_::Debug::shouldLog(ERROR);
    while (local_239 != false) {
      local_240 = 0xc;
      List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
                (&local_270,(Builder *)local_1e8,0);
      local_241 = capnproto_test::capnp::test::TestLists::Struct8::Builder::getF(&local_270);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x272,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
                 (char (*) [40])"failed: expected (12u) == (l[0].getF())",&local_240,&local_241);
      local_239 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_298,(Builder *)local_1e8,1);
  uVar1 = capnproto_test::capnp::test::TestLists::Struct8::Builder::getF((Builder *)local_298);
  if (uVar1 != '\"') {
    local_299 = kj::_::Debug::shouldLog(ERROR);
    while (local_299 != false) {
      local_2a0 = 0x22;
      List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
                (&local_2d0,(Builder *)local_1e8,1);
      local_2a1 = capnproto_test::capnp::test::TestLists::Struct8::Builder::getF(&local_2d0);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x273,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
                 (char (*) [40])"failed: expected (34u) == (l[1].getF())",&local_2a0,&local_2a1);
      local_299 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_2f8,(Builder *)local_1e8,2);
  uVar1 = capnproto_test::capnp::test::TestLists::Struct8::Builder::getF((Builder *)local_2f8);
  if (uVar1 != '8') {
    local_2f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2f9 != false) {
      local_300 = 0x38;
      List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
                (&local_330,(Builder *)local_1e8,2);
      local_301 = capnproto_test::capnp::test::TestLists::Struct8::Builder::getF(&local_330);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x274,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
                 (char (*) [40])"failed: expected (56u) == (l[2].getF())",&local_300,&local_301);
      local_2f9 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_370,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_358,&local_370);
  reader._reader.nestingLimit._2_2_ = 0xc;
  reader._reader._44_2_ = 0x22;
  reader._reader._46_2_ = 0x38;
  expected_01._M_len = 3;
  expected_01._M_array = (iterator)((long)&reader._reader.nestingLimit + 2);
  reader_01.builder.capTable = local_358.builder.capTable;
  reader_01.builder.segment = local_358.builder.segment;
  reader_01.builder.ptr = local_358.builder.ptr;
  reader_01.builder.elementCount = local_358.builder.elementCount;
  reader_01.builder.step = local_358.builder.step;
  reader_01.builder.structDataSize = local_358.builder.structDataSize;
  reader_01.builder.structPointerCount = local_358.builder.structPointerCount;
  reader_01.builder.elementSize = local_358.builder.elementSize;
  reader_01.builder._39_1_ = local_358.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_01,expected_01);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)local_3b8,(Builder *)local_128);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_408,(Reader *)local_3b8);
  AnyPointer::Reader::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_3e8,&local_408);
  l_1.reader._45_1_ = 0xc;
  l_1.reader._46_1_ = 0x22;
  l_1.reader._47_1_ = 0x38;
  expected_00._M_len = 3;
  expected_00._M_array = &l_1.reader.field_0x2d;
  reader_02.reader.capTable = local_3e8.reader.capTable;
  reader_02.reader.segment = local_3e8.reader.segment;
  reader_02.reader.ptr = local_3e8.reader.ptr;
  reader_02.reader.elementCount = local_3e8.reader.elementCount;
  reader_02.reader.step = local_3e8.reader.step;
  reader_02.reader.structDataSize = local_3e8.reader.structDataSize;
  reader_02.reader.structPointerCount = local_3e8.reader.structPointerCount;
  reader_02.reader.elementSize = local_3e8.reader.elementSize;
  reader_02.reader._39_1_ = local_3e8.reader._39_1_;
  reader_02.reader.nestingLimit = local_3e8.reader.nestingLimit;
  reader_02.reader._44_4_ = local_3e8.reader._44_4_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_02,expected_00);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            ((Reader *)&f_1,(Reader *)local_3b8);
  AnyPointer::Reader::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>_>
              *)local_450,(Reader *)&f_1);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::size
                    ((Reader *)local_450);
  if (uVar3 != 3) {
    local_47c = 3;
    local_480 = List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::size
                          ((Reader *)local_450);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_478,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x27f,FAILED,"(3u) == (l.size())","3u, l.size()",&local_47c,&local_480);
    kj::_::Debug::Fault::fatal(&local_478);
  }
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_4b0,(Reader *)local_450,0);
  uVar1 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF((Reader *)local_4b0);
  if (uVar1 != '\f') {
    local_4b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4b1 != false) {
      local_4b8 = 0xc;
      List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
                (&local_4f0,(Reader *)local_450,0);
      local_4b9 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF(&local_4f0);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x280,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
                 (char (*) [40])"failed: expected (12u) == (l[0].getF())",&local_4b8,&local_4b9);
      local_4b1 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_520,(Reader *)local_450,1);
  uVar1 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF((Reader *)local_520);
  if (uVar1 != '\"') {
    local_521 = kj::_::Debug::shouldLog(ERROR);
    while (local_521 != false) {
      local_528 = 0x22;
      List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
                (&local_560,(Reader *)local_450,1);
      local_529 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF(&local_560);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x281,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
                 (char (*) [40])"failed: expected (34u) == (l[1].getF())",&local_528,&local_529);
      local_521 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_590,(Reader *)local_450,2);
  uVar1 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF((Reader *)local_590);
  if (uVar1 != '8') {
    local_591 = kj::_::Debug::shouldLog(ERROR);
    while (local_591 != false) {
      local_598 = 0x38;
      List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Reader::operator[]
                (&local_5d0,(Reader *)local_450,2);
      local_599 = capnproto_test::capnp::test::TestLists::Struct8::Reader::getF(&local_5d0);
      kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x282,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
                 (char (*) [40])"failed: expected (56u) == (l[2].getF())",&local_598,&local_599);
      local_591 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_5e8,(Builder *)local_128);
  e.ptr.field_1.value.traceCount._2_2_ = 0xc;
  e.ptr.field_1._340_2_ = 0x22;
  e.ptr.field_1._342_2_ = 0x38;
  list._M_len = 3;
  list._M_array = (iterator)((long)&e.ptr.field_1 + 0x152);
  AnyPointer::Builder::setAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_5e8,list);
  puStack_768 = local_3b8;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase615::run()::__0>
            ((Maybe<kj::Exception> *)local_760,(kj *)&stack0xfffffffffffff898,func);
  bVar2 = kj::Maybe<kj::Exception>::operator!=((Maybe<kj::Exception> *)local_760,(void *)0x0);
  if (!bVar2) {
    l_2.reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (l_2.reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x28f,ERROR,
                 "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
                 (char (*) [30])"failed: expected e != nullptr",
                 (char (*) [33])"Should have thrown an exception.");
      l_2.reader._47_1_ = 0;
    }
  }
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_760);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            ((Reader *)&f_2,(Reader *)local_3b8);
  AnyPointer::Reader::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>_>
              *)local_7a0,(Reader *)&f_2);
  uVar3 = List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::size
                    ((Reader *)local_7a0);
  if (uVar3 != 3) {
    local_7cc = 3;
    local_7d0 = List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::size
                          ((Reader *)local_7a0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_7c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x294,FAILED,"(3u) == (l.size())","3u, l.size()",&local_7cc,&local_7d0);
    kj::_::Debug::Fault::fatal(&local_7c8);
  }
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_800,(Reader *)local_7a0,0);
  uVar4 = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF((Reader *)local_800);
  if (uVar4 != 0) {
    local_801 = kj::_::Debug::shouldLog(ERROR);
    while (local_801 != false) {
      local_808 = 0;
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
                (&local_840,(Reader *)local_7a0,0);
      local_80c = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF(&local_840);
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x297,ERROR,"\"failed: expected \" \"(0u) == (l[0].getF())\", 0u, l[0].getF()",
                 (char (*) [39])"failed: expected (0u) == (l[0].getF())",&local_808,&local_80c);
      local_801 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_870,(Reader *)local_7a0,1);
  uVar4 = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF((Reader *)local_870);
  if (uVar4 != 0) {
    local_871 = kj::_::Debug::shouldLog(ERROR);
    while (local_871 != false) {
      local_878 = 0;
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
                (&local_8b0,(Reader *)local_7a0,1);
      local_87c = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF(&local_8b0);
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x298,ERROR,"\"failed: expected \" \"(0u) == (l[1].getF())\", 0u, l[1].getF()",
                 (char (*) [39])"failed: expected (0u) == (l[1].getF())",&local_878,&local_87c);
      local_871 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_8e0,(Reader *)local_7a0,2);
  uVar4 = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF((Reader *)local_8e0);
  if (uVar4 != 0) {
    local_8e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_8e1 != false) {
      local_8e8 = 0;
      List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>::Reader::operator[]
                (&local_920,(Reader *)local_7a0,2);
      local_8ec = capnproto_test::capnp::test::TestLists::Struct32::Reader::getF(&local_920);
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x299,ERROR,"\"failed: expected \" \"(0u) == (l[2].getF())\", 0u, l[2].getF()",
                 (char (*) [39])"failed: expected (0u) == (l[2].getF())",&local_8e8,&local_8ec);
      local_8e1 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_970,(Reader *)local_3b8);
  AnyPointer::Reader::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_950,&local_970);
  local_986[0] = 0xc;
  local_986[1] = 0x22;
  local_986[2] = 0x38;
  local_980 = local_986;
  local_978 = 3;
  expected._M_len = 3;
  expected._M_array = local_980;
  reader_03.reader.capTable = local_950.reader.capTable;
  reader_03.reader.segment = local_950.reader.segment;
  reader_03.reader.ptr = local_950.reader.ptr;
  reader_03.reader.elementCount = local_950.reader.elementCount;
  reader_03.reader.step = local_950.reader.step;
  reader_03.reader.structDataSize = local_950.reader.structDataSize;
  reader_03.reader.structPointerCount = local_950.reader.structPointerCount;
  reader_03.reader.elementSize = local_950.reader.elementSize;
  reader_03.reader._39_1_ = local_950.reader._39_1_;
  reader_03.reader.nestingLimit = local_950.reader.nestingLimit;
  reader_03.reader._44_4_ = local_950.reader._44_4_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_03,expected);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, ListUpgrade) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint16_t>>({12, 34, 56});

  checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {12, 34, 56});

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct8>>();
    ASSERT_EQ(3u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
  }

  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {12, 34, 56});

  auto reader = root.asReader();

  checkList(reader.getAnyPointerField().getAs<List<uint8_t>>(), {12, 34, 56});

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct8>>();
    ASSERT_EQ(3u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
  }

  root.getAnyPointerField().setAs<List<uint16_t>>({12, 34, 56});

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      reader.getAnyPointerField().getAs<List<uint32_t>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct32>>();
    ASSERT_EQ(3u, l.size());

    // These should return default values because the structs aren't big enough.
    EXPECT_EQ(0u, l[0].getF());
    EXPECT_EQ(0u, l[1].getF());
    EXPECT_EQ(0u, l[2].getF());
  }

  checkList(reader.getAnyPointerField().getAs<List<uint16_t>>(), {12, 34, 56});
}